

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

void __thiscall QInputDialogPrivate::setComboBoxText(QInputDialogPrivate *this,QString *text)

{
  QComboBox *this_00;
  bool bVar1;
  int index;
  long in_FS_OFFSET;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->comboBox;
  ::QVariant::QVariant(&local_50,(QString *)text);
  index = QComboBox::findData(this_00,&local_50,0,(MatchFlags)0x10);
  ::QVariant::~QVariant(&local_50);
  if (index == -1) {
    bVar1 = QComboBox::isEditable(this->comboBox);
    if (bVar1) {
      QComboBox::setEditText(this->comboBox,text);
    }
  }
  else {
    QComboBox::setCurrentIndex(this->comboBox,index);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::setComboBoxText(const QString &text)
{
    int index = comboBox->findText(text);
    if (index != -1) {
        comboBox->setCurrentIndex(index);
    } else if (comboBox->isEditable()) {
        comboBox->setEditText(text);
    }
}